

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c
# Opt level: O0

LY_ERR lyjson_exp_number(ly_ctx *ctx,char *in,char *exponent,uint64_t total_len,char **res,
                        size_t *res_len)

{
  ushort uVar1;
  uint uVar2;
  int dp_position_00;
  uint32_t uVar3;
  LY_ERR LVar4;
  int *piVar5;
  longlong lVar6;
  char *dec_point_00;
  size_t __n;
  ulong uVar7;
  bool bVar8;
  bool bVar9;
  short local_b4;
  LY_ERR ret___4;
  LY_ERR ret___3;
  LY_ERR ret___2;
  LY_ERR ret___1;
  LY_ERR ret__;
  ly_bool leading_zero;
  long zeros;
  uint8_t minus;
  int8_t dot;
  longlong e_val;
  int32_t dp_position;
  char *dec_point;
  char *pcStack_60;
  uint16_t num_len;
  char *num;
  uint64_t uStack_50;
  uint32_t i;
  uint64_t buf_len;
  char *buf;
  size_t *res_len_local;
  char **res_local;
  uint64_t total_len_local;
  char *exponent_local;
  char *in_local;
  ly_ctx *ctx_local;
  
  buf = (char *)res_len;
  res_len_local = (size_t *)res;
  res_local = (char **)total_len;
  total_len_local = (uint64_t)exponent;
  exponent_local = in;
  in_local = (char *)ctx;
  if (((((ctx == (ly_ctx *)0x0) || (in == (char *)0x0)) || (exponent == (char *)0x0)) ||
      ((res == (char **)0x0 || (res_len == (size_t *)0x0)))) || (total_len < 3)) {
    __assert_fail("ctx && in && exponent && res && res_len && (total_len > 2)",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/json.c",
                  0x1e5,
                  "LY_ERR lyjson_exp_number(const struct ly_ctx *, const char *, const char *, uint64_t, char **, size_t *)"
                 );
  }
  if ((exponent <= in) || ((*exponent != 'e' && (*exponent != 'E')))) {
    __assert_fail("(in < exponent) && ((*exponent == \'e\') || (*exponent == \'E\'))",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/json.c",
                  0x1e6,
                  "LY_ERR lyjson_exp_number(const struct ly_ctx *, const char *, const char *, uint64_t, char **, size_t *)"
                 );
  }
  if ((long)exponent - (long)in < 0x10000) {
    piVar5 = __errno_location();
    *piVar5 = 0;
    lVar6 = strtoll((char *)(total_len_local + 1),(char **)0x0,10);
    piVar5 = __errno_location();
    if (((*piVar5 == 0) && (lVar6 < 0x10000)) && (-0x10000 < lVar6)) {
      bVar8 = *exponent_local == '-';
      if (exponent_local[bVar8] == '0') {
        if (exponent_local[(int)(bVar8 + 1)] != '.') {
          __assert_fail("in[minus + 1] == \'.\'",
                        "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/json.c"
                        ,0x1f9,
                        "LY_ERR lyjson_exp_number(const struct ly_ctx *, const char *, const char *, uint64_t, char **, size_t *)"
                       );
        }
        bVar9 = true;
        uVar7 = (ulong)(int)(bVar8 + 1);
      }
      else {
        bVar9 = false;
        uVar7 = (ulong)bVar8;
      }
      pcStack_60 = exponent_local + uVar7;
      uVar1 = (short)total_len_local - (short)pcStack_60;
      dec_point_00 = ly_strnchr(pcStack_60,0x2e,(ulong)uVar1);
      if (dec_point_00 == (char *)0x0) {
        uVar2 = (uint)uVar1;
      }
      else {
        uVar2 = (int)dec_point_00 - (int)pcStack_60;
      }
      dp_position_00 = uVar2 + (int)lVar6;
      if (dp_position_00 < 1) {
        uVar3 = lyjson_count_in_row(pcStack_60,(char *)total_len_local,'0','\x01');
        local_b4 = (short)uVar3;
      }
      else {
        uVar3 = lyjson_count_in_row(pcStack_60 + (long)dp_position_00 + -1,(char *)total_len_local,
                                    '0','\x01');
        local_b4 = (short)uVar3;
      }
      uVar1 = uVar1 - local_b4;
      if ((dec_point_00 == (char *)0x0) || (uVar1 - 1 != dp_position_00)) {
        zeros._7_1_ = dec_point_00 == (char *)0x0;
      }
      else {
        zeros._7_1_ = -1;
      }
      if (dp_position_00 < 1) {
        __n = (size_t)dp_position_00;
        if ((long)__n < 1) {
          __n = -__n;
        }
        uStack_50 = (long)(int)(bVar8 + 1 + (int)zeros._7_1_) + __n + (ulong)uVar1;
        LVar4 = lyjson_get_buffer_for_number((ly_ctx *)in_local,uStack_50,(char **)&buf_len);
        if (LVar4 != LY_SUCCESS) {
          return LVar4;
        }
        if (bVar8) {
          *(undefined1 *)buf_len = 0x2d;
        }
        num._4_4_ = (uint)bVar8;
        *(undefined1 *)(buf_len + num._4_4_) = 0x30;
        *(undefined1 *)(buf_len + (num._4_4_ + 1)) = 0x2e;
        memset((void *)(buf_len + (num._4_4_ + 2)),0x30,__n);
        lyjson_exp_number_copy_num_part
                  (pcStack_60,(uint)uVar1,dec_point_00,-1,
                   (char *)(buf_len + (num._4_4_ + 2 + (int)__n)));
      }
      else if ((bVar9) && (dp_position_00 < (int)(uint)uVar1)) {
        pcStack_60 = pcStack_60 + 1;
        e_val._4_4_ = dp_position_00 + -1;
        uVar3 = lyjson_count_in_row(pcStack_60,pcStack_60 + (long)e_val._4_4_ + 1,'0','\0');
        _ret__ = (ulong)uVar3;
        bVar9 = _ret__ == (long)dp_position_00;
        if (bVar9) {
          _ret__ = _ret__ - 1;
          e_val._4_4_ = 1;
        }
        uStack_50 = (long)(int)((uint)bVar8 + (int)bVar9) + ((ushort)(uVar1 - 1) - _ret__);
        LVar4 = lyjson_get_buffer_for_number((ly_ctx *)in_local,uStack_50,(char **)&buf_len);
        if (LVar4 != LY_SUCCESS) {
          return LVar4;
        }
        if (bVar8) {
          *(undefined1 *)buf_len = 0x2d;
        }
        lyjson_exp_number_copy_num_part
                  (pcStack_60 + _ret__,(uint)(ushort)(uVar1 - 1) - (int)_ret__,(char *)0x0,
                   e_val._4_4_,(char *)(buf_len + bVar8));
      }
      else if (dp_position_00 < (int)(uint)uVar1) {
        uStack_50 = (uint64_t)(int)((uint)bVar8 + (int)zeros._7_1_ + (uint)uVar1);
        LVar4 = lyjson_get_buffer_for_number((ly_ctx *)in_local,uStack_50,(char **)&buf_len);
        if (LVar4 != LY_SUCCESS) {
          return LVar4;
        }
        if (bVar8) {
          *(undefined1 *)buf_len = 0x2d;
        }
        lyjson_exp_number_copy_num_part
                  (pcStack_60,(uint)uVar1,dec_point_00,dp_position_00,(char *)(buf_len + bVar8));
      }
      else if (bVar9) {
        pcStack_60 = pcStack_60 + 1;
        uVar3 = lyjson_count_in_row(pcStack_60,pcStack_60 + (int)(uint)(ushort)(uVar1 - 1),'0','\0')
        ;
        uStack_50 = (long)(int)((uint)bVar8 + dp_position_00) - (ulong)uVar3;
        LVar4 = lyjson_get_buffer_for_number((ly_ctx *)in_local,uStack_50,(char **)&buf_len);
        if (LVar4 != LY_SUCCESS) {
          return LVar4;
        }
        if (bVar8) {
          *(undefined1 *)buf_len = 0x2d;
        }
        num._4_4_ = (uint)bVar8;
        uVar3 = lyjson_exp_number_copy_num_part
                          (pcStack_60 + uVar3,(ushort)(uVar1 - 1) - uVar3,(char *)0x0,dp_position_00
                           ,(char *)(buf_len + num._4_4_));
        memset((void *)(buf_len + (uVar3 + num._4_4_)),0x30,uStack_50 - (uVar3 + num._4_4_));
      }
      else {
        uStack_50 = (uint64_t)(int)((uint)bVar8 + dp_position_00);
        LVar4 = lyjson_get_buffer_for_number((ly_ctx *)in_local,uStack_50,(char **)&buf_len);
        if (LVar4 != LY_SUCCESS) {
          return LVar4;
        }
        if (bVar8) {
          *(undefined1 *)buf_len = 0x2d;
        }
        num._4_4_ = (uint)bVar8;
        uVar3 = lyjson_exp_number_copy_num_part
                          (pcStack_60,(uint)uVar1,dec_point_00,dp_position_00,
                           (char *)(buf_len + num._4_4_));
        memset((void *)(buf_len + (uVar3 + num._4_4_)),0x30,uStack_50 - (uVar3 + num._4_4_));
      }
      *(undefined1 *)(buf_len + uStack_50) = 0;
      *res_len_local = buf_len;
      *(uint64_t *)buf = uStack_50;
      ctx_local._4_4_ = LY_SUCCESS;
    }
    else {
      ly_vlog((ly_ctx *)in_local,(char *)0x0,LYVE_SEMANTICS,
              "Exponent out-of-bounds in a JSON Number value (%.*s).",(ulong)res_local & 0xffffffff,
              exponent_local);
      ctx_local._4_4_ = LY_EVALID;
    }
  }
  else {
    ly_vlog(ctx,(char *)0x0,LYVE_SEMANTICS,"JSON number is too long.");
    ctx_local._4_4_ = LY_EVALID;
  }
  return ctx_local._4_4_;
}

Assistant:

static LY_ERR
lyjson_exp_number(const struct ly_ctx *ctx, const char *in, const char *exponent, uint64_t total_len, char **res,
        size_t *res_len)
{

#define MAYBE_WRITE_MINUS(ARRAY, INDEX, FLAG) \
        if (FLAG) { \
            ARRAY[INDEX++] = '-'; \
        }

/* Length of leading zero followed by the decimal point. */
#define LEADING_ZERO 1

/* Flags for the ::lyjson_count_in_row() */
#define FORWARD 0
#define BACKWARD 1

    /* Buffer where the result is stored. */
    char *buf;
    /* Size without space for terminating NULL-byte. */
    uint64_t buf_len;
    /* Index to buf. */
    uint32_t i = 0;
    /* A 'numeric part' doesn't contain a minus sign or an leading zero.
     * For example, in 0.45, there is the leading zero.
     */
    const char *num;
    /* Length of the 'numeric part' ends before E/e. */
    uint16_t num_len;
    /* Position of decimal point in the num. */
    char *dec_point;
    /* Final position of decimal point in the buf. */
    int32_t dp_position;
    /* Exponent as integer. */
    long long e_val;
    /* Byte for the decimal point. */
    int8_t dot;
    /* Required additional byte for the minus sign. */
    uint8_t minus;
    /* The number of zeros. */
    long zeros;
    /* If the number starts with leading zero followed by the decimal point. */
    ly_bool leading_zero;

    assert(ctx && in && exponent && res && res_len && (total_len > 2));
    assert((in < exponent) && ((*exponent == 'e') || (*exponent == 'E')));

    if ((exponent - in) > UINT16_MAX) {
        LOGVAL(ctx, LYVE_SEMANTICS, "JSON number is too long.");
        return LY_EVALID;
    }

    /* Convert exponent. */
    errno = 0;
    e_val = strtoll(exponent + 1, NULL, LY_BASE_DEC);
    if (errno || (e_val > UINT16_MAX) || (e_val < -UINT16_MAX)) {
        LOGVAL(ctx, LYVE_SEMANTICS,
                "Exponent out-of-bounds in a JSON Number value (%.*s).",
                (int)total_len, in);
        return LY_EVALID;
    }

    minus = in[0] == '-';
    if (in[minus] == '0') {
        assert(in[minus + 1] == '.');
        leading_zero = 1;
        /* The leading zero has been found, it will be skipped. */
        num = &in[minus + 1];
    } else {
        leading_zero = 0;
        /* Set to the first number. */
        num = &in[minus];
    }
    num_len = exponent - num;

    /* Find the location of the decimal points. */
    dec_point = ly_strnchr(num, '.', num_len);
    dp_position = dec_point ?
            dec_point - num + e_val :
            num_len + e_val;

    /* Remove zeros after the decimal point from the end of
     * the 'numeric part' because these are useless.
     * (For example, in 40.001000 these are the last 3).
     */
    num_len -= dp_position > 0 ?
            lyjson_count_in_row(num + dp_position - 1, exponent, '0', BACKWARD) :
            lyjson_count_in_row(num, exponent, '0', BACKWARD);

    /* Decide what to do with the dot from the 'numeric part'. */
    if (dec_point && ((int32_t)(num_len - 1) == dp_position)) {
        /* Decimal point in the last place is useless. */
        dot = -1;
    } else if (dec_point) {
        /* Decimal point is shifted. */
        dot = 0;
    } else {
        /* Additional byte for the decimal point is requred. */
        dot = 1;
    }

    /* Final composition of the result. */
    if (dp_position <= 0) {
        /* Adding decimal point before the integer with adding additional zero(s). */

        zeros = labs(dp_position);
        buf_len = minus + LEADING_ZERO + dot + zeros + num_len;
        LY_CHECK_RET(lyjson_get_buffer_for_number(ctx, buf_len, &buf));
        MAYBE_WRITE_MINUS(buf, i, minus);
        buf[i++] = '0';
        buf[i++] = '.';
        memset(buf + i, '0', zeros);
        i += zeros;
        dp_position = -1;
        lyjson_exp_number_copy_num_part(num, num_len, dec_point, dp_position, buf + i);
    } else if (leading_zero && (dp_position < (ssize_t)num_len)) {
        /* Insert decimal point between the integer's digits. */

        /* Set a new range of 'numeric part'. Old decimal point is skipped. */
        num++;
        num_len--;
        dp_position--;
        /* Get the number of useless zeros between the old
         * and new decimal point. For example, in the number 0.005E1,
         * there is one useless zero.
         */
        zeros = lyjson_count_in_row(num, num + dp_position + 1, '0', FORWARD);
        /* If the new decimal point will be in the place of the first non-zero subnumber. */
        if (zeros == (dp_position + 1)) {
            /* keep one zero as leading zero */
            zeros--;
            /* new decimal point will be behind the leading zero */
            dp_position = 1;
            dot = 1;
        } else {
            dot = 0;
        }
        buf_len = minus + dot + (num_len - zeros);
        LY_CHECK_RET(lyjson_get_buffer_for_number(ctx, buf_len, &buf));
        MAYBE_WRITE_MINUS(buf, i, minus);
        /* Skip useless zeros and copy. */
        lyjson_exp_number_copy_num_part(num + zeros, num_len - zeros, NULL, dp_position, buf + i);
    } else if (dp_position < (ssize_t)num_len) {
        /* Insert decimal point between the integer's digits. */

        buf_len = minus + dot + num_len;
        LY_CHECK_RET(lyjson_get_buffer_for_number(ctx, buf_len, &buf));
        MAYBE_WRITE_MINUS(buf, i, minus);
        lyjson_exp_number_copy_num_part(num, num_len, dec_point, dp_position, buf + i);
    } else if (leading_zero) {
        /* Adding decimal point after the decimal value make the integer result. */

        /* Set a new range of 'numeric part'. Old decimal point is skipped. */
        num++;
        num_len--;
        /* Get the number of useless zeros. */
        zeros = lyjson_count_in_row(num, num + num_len, '0', FORWARD);
        buf_len = minus + dp_position - zeros;
        LY_CHECK_RET(lyjson_get_buffer_for_number(ctx, buf_len, &buf));
        MAYBE_WRITE_MINUS(buf, i, minus);
        /* Skip useless zeros and copy. */
        i += lyjson_exp_number_copy_num_part(num + zeros, num_len - zeros, NULL, dp_position, buf + i);
        /* Add multiples of ten behind the 'numeric part'. */
        memset(buf + i, '0', buf_len - i);
    } else {
        /* Adding decimal point after the decimal value make the integer result. */

        buf_len = minus + dp_position;
        LY_CHECK_RET(lyjson_get_buffer_for_number(ctx, buf_len, &buf));
        MAYBE_WRITE_MINUS(buf, i, minus);
        i += lyjson_exp_number_copy_num_part(num, num_len, dec_point, dp_position, buf + i);
        /* Add multiples of ten behind the 'numeric part'. */
        memset(buf + i, '0', buf_len - i);
    }

    buf[buf_len] = '\0';
    *res = buf;
    *res_len = buf_len;

#undef MAYBE_WRITE_MINUS
#undef LEADING_ZERO
#undef FORWARD
#undef BACKWARD

    return LY_SUCCESS;
}